

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

void __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *source,size_t length)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  CrtAllocator *this_00;
  size_t sVar5;
  Token *pTVar6;
  SizeType SVar7;
  ulong uVar8;
  char c;
  Ch *pCVar9;
  Ch *pCVar10;
  uint uVar11;
  size_t sVar12;
  Token *pTVar13;
  PercentDecodeStream is;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_48;
  
  if (source == (Ch *)0x0) {
    __assert_fail("source != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a3,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->nameBuffer_ != (Ch *)0x0) {
    __assert_fail("nameBuffer_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a4,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->tokens_ != (Token *)0x0) {
    __assert_fail("tokens_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a5,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  this_00 = this->allocator_;
  if (this_00 == (CrtAllocator *)0x0) {
    this_00 = (CrtAllocator *)operator_new(1);
    this->allocator_ = this_00;
    this->ownAllocator_ = this_00;
  }
  this->tokenCount_ = 0;
  sVar12 = 0;
  for (sVar5 = 0; length != sVar5; sVar5 = sVar5 + 1) {
    if (source[sVar5] == '/') {
      sVar12 = sVar12 + 1;
      this->tokenCount_ = sVar12;
    }
  }
  pTVar6 = (Token *)CrtAllocator::Malloc(this_00,sVar12 * 0x10 + length);
  this->tokens_ = pTVar6;
  pTVar13 = pTVar6 + this->tokenCount_;
  this->nameBuffer_ = (Ch *)pTVar13;
  cVar1 = *source;
  pCVar9 = (Ch *)(ulong)(cVar1 == '#');
  if ((pCVar9 != (Ch *)length) && (source[(long)pCVar9] != '/')) {
    this->parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
LAB_00147ae7:
    free(this->tokens_);
    this->nameBuffer_ = (Ch *)0x0;
    this->tokens_ = (Token *)0x0;
    this->tokenCount_ = 0;
    this->parseErrorOffset_ = (size_t)pCVar9;
    return;
  }
  do {
    if (length <= pCVar9) {
      if (pTVar13 <= (Token *)(this->nameBuffer_ + length)) {
        this->parseErrorCode_ = kPointerParseErrorNone;
        return;
      }
      __assert_fail("name <= nameBuffer_ + length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                    ,0x419,
                    "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    if (source[(long)pCVar9] != '/') {
      __assert_fail("source[i] == \'/\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                    ,0x3c2,
                    "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    pCVar9 = pCVar9 + 1;
    pTVar6->name = (Ch *)pTVar13;
    bVar2 = true;
    while ((pCVar9 < length && (c = source[(long)pCVar9], c != '/'))) {
      pCVar10 = pCVar9;
      if (cVar1 == '#') {
        if (c != '%') {
          bVar3 = NeedPercentEncode(this,c);
          if (!bVar3) goto LAB_001479c0;
          this->parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
          goto LAB_00147ae7;
        }
        is.src_ = source + (long)pCVar9;
        is.valid_ = true;
        is.head_ = is.src_;
        is.end_ = source + length;
        local_48.src_ = (Ch *)pTVar13;
        local_48.dst_ = (Ch *)pTVar13;
        local_48.head_ = (Ch *)pTVar13;
        bVar3 = UTF8<char>::
                Validate<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentDecodeStream,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                          (&is,&local_48);
        if ((!bVar3) || (is.valid_ == false)) {
          this->parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
          goto LAB_00147ae7;
        }
        if ((long)local_48.dst_ - (long)pTVar13 == 1) {
          c = *(char *)&pTVar13->name;
          pCVar10 = is.src_ + (long)(pCVar9 + (-1 - (long)is.head_));
          goto LAB_001479c0;
        }
        pTVar13 = (Token *)((long)pTVar13 + ((long)local_48.dst_ - (long)pTVar13));
        pCVar9 = is.src_ + ((long)pCVar9 - (long)is.head_);
        bVar2 = false;
      }
      else {
LAB_001479c0:
        pCVar9 = pCVar10 + 1;
        if (c == '~') {
          if (length <= pCVar9) {
LAB_00147aae:
            this->parseErrorCode_ = kPointerParseErrorInvalidEscape;
            goto LAB_00147ae7;
          }
          c = '~';
          if (source[(long)pCVar9] != '0') {
            if (source[(long)pCVar9] != '1') goto LAB_00147aae;
            c = '/';
          }
          pCVar9 = pCVar10 + 2;
        }
        if ((byte)(c - 0x3aU) < 0xf6) {
          bVar2 = false;
        }
        *(char *)&pTVar13->name = c;
        pTVar13 = (Token *)((long)&pTVar13->name + 1);
      }
    }
    SVar7 = (int)pTVar13 - *(int *)&pTVar6->name;
    pTVar6->length = SVar7;
    if (SVar7 == 0) {
      bVar2 = false;
    }
    *(Ch *)&pTVar13->name = '\0';
    if (((bVar2) && (1 < pTVar6->length)) && (*pTVar6->name == '0')) {
      bVar2 = false;
    }
    uVar4 = 0xffffffff;
    if (bVar2) {
      uVar8 = 0;
      uVar4 = 0;
      do {
        if (pTVar6->length == uVar8) {
          if (!bVar2) {
            uVar4 = 0xffffffff;
          }
          goto LAB_00147a9e;
        }
        uVar11 = (uVar4 * 10 + (int)pTVar6->name[uVar8]) - 0x30;
        uVar8 = uVar8 + 1;
        bVar3 = uVar4 <= uVar11;
        uVar4 = uVar11;
      } while (bVar3);
      uVar4 = 0xffffffff;
    }
LAB_00147a9e:
    pTVar13 = (Token *)((long)&pTVar13->name + 1);
    pTVar6->index = uVar4;
    pTVar6 = pTVar6 + 1;
  } while( true );
}

Assistant:

void Parse(const Ch* source, size_t length) {
        RAPIDJSON_ASSERT(source != NULL);
        RAPIDJSON_ASSERT(nameBuffer_ == 0);
        RAPIDJSON_ASSERT(tokens_ == 0);

        // Create own allocator if user did not supply.
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();

        // Count number of '/' as tokenCount
        tokenCount_ = 0;
        for (const Ch* s = source; s != source + length; s++) 
            if (*s == '/')
                tokenCount_++;

        Token* token = tokens_ = static_cast<Token *>(allocator_->Malloc(tokenCount_ * sizeof(Token) + length * sizeof(Ch)));
        Ch* name = nameBuffer_ = reinterpret_cast<Ch *>(tokens_ + tokenCount_);
        size_t i = 0;

        // Detect if it is a URI fragment
        bool uriFragment = false;
        if (source[i] == '#') {
            uriFragment = true;
            i++;
        }

        if (i != length && source[i] != '/') {
            parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
            goto error;
        }

        while (i < length) {
            RAPIDJSON_ASSERT(source[i] == '/');
            i++; // consumes '/'

            token->name = name;
            bool isNumber = true;

            while (i < length && source[i] != '/') {
                Ch c = source[i];
                if (uriFragment) {
                    // Decoding percent-encoding for URI fragment
                    if (c == '%') {
                        PercentDecodeStream is(&source[i], source + length);
                        GenericInsituStringStream<EncodingType> os(name);
                        Ch* begin = os.PutBegin();
                        if (!Transcoder<UTF8<>, EncodingType>().Validate(is, os) || !is.IsValid()) {
                            parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
                            goto error;
                        }
                        size_t len = os.PutEnd(begin);
                        i += is.Tell() - 1;
                        if (len == 1)
                            c = *name;
                        else {
                            name += len;
                            isNumber = false;
                            i++;
                            continue;
                        }
                    }
                    else if (NeedPercentEncode(c)) {
                        parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
                        goto error;
                    }
                }

                i++;

                // Escaping "~0" -> '~', "~1" -> '/'
                if (c == '~') {
                    if (i < length) {
                        c = source[i];
                        if (c == '0')       c = '~';
                        else if (c == '1')  c = '/';
                        else {
                            parseErrorCode_ = kPointerParseErrorInvalidEscape;
                            goto error;
                        }
                        i++;
                    }
                    else {
                        parseErrorCode_ = kPointerParseErrorInvalidEscape;
                        goto error;
                    }
                }

                // First check for index: all of characters are digit
                if (c < '0' || c > '9')
                    isNumber = false;

                *name++ = c;
            }
            token->length = static_cast<SizeType>(name - token->name);
            if (token->length == 0)
                isNumber = false;
            *name++ = '\0'; // Null terminator

            // Second check for index: more than one digit cannot have leading zero
            if (isNumber && token->length > 1 && token->name[0] == '0')
                isNumber = false;

            // String to SizeType conversion
            SizeType n = 0;
            if (isNumber) {
                for (size_t j = 0; j < token->length; j++) {
                    SizeType m = n * 10 + static_cast<SizeType>(token->name[j] - '0');
                    if (m < n) {   // overflow detection
                        isNumber = false;
                        break;
                    }
                    n = m;
                }
            }

            token->index = isNumber ? n : kPointerInvalidIndex;
            token++;
        }

        RAPIDJSON_ASSERT(name <= nameBuffer_ + length); // Should not overflow buffer
        parseErrorCode_ = kPointerParseErrorNone;
        return;

    error:
        Allocator::Free(tokens_);
        nameBuffer_ = 0;
        tokens_ = 0;
        tokenCount_ = 0;
        parseErrorOffset_ = i;
        return;
    }